

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimeNodePrint(SC_Man *p,Abc_Obj_t *pObj,int fRise,int Length,float maxDelay)

{
  float fVar1;
  char *pcVar2;
  SC_Cell *p_00;
  void *pvVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    p_00 = Abc_SclObjCell(pObj);
  }
  else {
    p_00 = (SC_Cell *)0x0;
  }
  printf("%8d : ",(ulong)(uint)pObj->Id);
  printf("%d ",(ulong)(uint)(pObj->vFanins).nSize);
  printf("%4d ",(ulong)(uint)(pObj->vFanouts).nSize);
  if (p_00 == (SC_Cell *)0x0) {
    printf("%-*s ",(ulong)(uint)Length,"pi");
    dVar7 = 0.0;
  }
  else {
    printf("%-*s ",(ulong)(uint)Length,p_00->pName);
    dVar7 = (double)p_00->area;
  }
  printf("A =%7.2f  ",dVar7);
  pcVar2 = " TXr; >Xrs Yqo o!Yq oHYq oqYa 7Yq Y87q 7HYq Ya7q SoYq YqoS! oZYq YqaoZ rY r";
  if (fRise == 0) {
    pcVar2 = "Xe 1XJe J18Xe IXeG0K I!XKGe0 JTXe0 aXeJT0 1GIXje 8eGj1IX J1TXe sJ1Xe IXf0 f";
  }
  printf("D%s =",pcVar2 + 0x4a);
  fVar5 = p->pTimes[(uint)pObj->Id].rise;
  fVar1 = p->pTimes[(uint)pObj->Id].fall;
  if (fVar5 <= fVar1) {
    fVar5 = fVar1;
  }
  printf("%6.1f",(double)fVar5);
  fVar5 = p->pTimes[(uint)pObj->Id].fall - p->pTimes[(uint)pObj->Id].rise;
  if (-fVar5 <= fVar5) {
    fVar5 = -fVar5;
  }
  printf("%7.1f ps  ",(double)fVar5);
  fVar5 = p->pSlews[(uint)pObj->Id].rise;
  fVar1 = p->pSlews[(uint)pObj->Id].fall;
  if (fVar5 <= fVar1) {
    fVar5 = fVar1;
  }
  printf("S =%6.1f ps  ",(double)fVar5);
  if (p_00 == (SC_Cell *)0x0) {
    printf("Cin =%5.1f ff  ",0);
    fVar5 = p->pLoads[(uint)pObj->Id].rise;
    fVar1 = p->pLoads[(uint)pObj->Id].fall;
    if (fVar5 <= fVar1) {
      fVar5 = fVar1;
    }
    printf("Cout =%6.1f ff  ",(double)fVar5);
    dVar7 = 0.0;
  }
  else {
    fVar5 = SC_CellPinCapAve(p_00);
    printf("Cin =%5.1f ff  ",(double)fVar5);
    fVar5 = p->pLoads[(uint)pObj->Id].rise;
    fVar1 = p->pLoads[(uint)pObj->Id].fall;
    if (fVar5 <= fVar1) {
      fVar5 = fVar1;
    }
    printf("Cout =%6.1f ff  ",(double)fVar5);
    pvVar3 = Vec_PtrEntry(&p_00->vPins,p_00->n_inputs);
    dVar7 = (double)*(float *)((long)pvVar3 + 0x20);
  }
  printf("Cmax =%6.1f ff  ",dVar7);
  if (p_00 == (SC_Cell *)0x0) {
    uVar4 = 0;
  }
  else {
    fVar5 = p->pLoads[(uint)pObj->Id].rise;
    fVar1 = p->pLoads[(uint)pObj->Id].fall;
    fVar6 = SC_CellPinCapAve(p_00);
    uVar4 = (ulong)(uint)(int)(((fVar5 * 0.5 + fVar1 * 0.5) * 100.0) / fVar6);
  }
  printf("G =%5d  ",uVar4);
  putchar(10);
  return;
}

Assistant:

static inline void Abc_SclTimeNodePrint( SC_Man * p, Abc_Obj_t * pObj, int fRise, int Length, float maxDelay )
{
    SC_Cell * pCell = Abc_ObjIsNode(pObj) ? Abc_SclObjCell(pObj) : NULL;
    printf( "%8d : ",           Abc_ObjId(pObj) );
    printf( "%d ",              Abc_ObjFaninNum(pObj) );
    printf( "%4d ",             Abc_ObjFanoutNum(pObj) );
    printf( "%-*s ",            Length, pCell ? pCell->pName : "pi" );
    printf( "A =%7.2f  ",       pCell ? pCell->area : 0.0 );
    printf( "D%s =",            fRise ? "r" : "f" );
    printf( "%6.1f",            Abc_SclObjTimeMax(p, pObj) );
    printf( "%7.1f ps  ",       -Abc_AbsFloat(Abc_SclObjTimeOne(p, pObj, 0) - Abc_SclObjTimeOne(p, pObj, 1)) );
    printf( "S =%6.1f ps  ",    Abc_SclObjSlewMax(p, pObj) );
    printf( "Cin =%5.1f ff  ",  pCell ? SC_CellPinCapAve(pCell) : 0.0 );
    printf( "Cout =%6.1f ff  ", Abc_SclObjLoadMax(p, pObj) );
    printf( "Cmax =%6.1f ff  ", pCell ? SC_CellPin(pCell, pCell->n_inputs)->max_out_cap : 0.0 );
    printf( "G =%5d  ",         pCell ? (int)(100.0 * Abc_SclObjLoadAve(p, pObj) / SC_CellPinCapAve(pCell)) : 0 );
//    printf( "SL =%6.1f ps",     Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    printf( "\n" );
}